

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::StructElement::visitExpressions
          (StructElement *this,ExpressionVisitorFn fn,AccessType mode)

{
  bool condition;
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> local_28;
  AccessType local_1c;
  ExpressionVisitorFn pfStack_18;
  AccessType mode_local;
  ExpressionVisitorFn fn_local;
  StructElement *this_local;
  
  local_1c = mode;
  pfStack_18 = fn;
  fn_local = (ExpressionVisitorFn)this;
  pEVar1 = pool_ref<soul::heart::Expression>::operator->(&this->parent);
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,pfStack_18,(ulong)local_1c);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (pfStack_18,&this->parent,local_1c);
  local_28.object = (this->parent).object;
  condition = soul::operator!=(&local_28,this);
  checkAssertion(condition,"parent != *this","visitExpressions",0x28f);
  pool_ref<soul::heart::Expression>::~pool_ref(&local_28);
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn, AccessType mode) override
        {
            parent->visitExpressions (fn, mode);
            fn (parent, mode);
            SOUL_ASSERT (parent != *this);
        }